

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEDate.cpp
# Opt level: O2

bool __thiscall test_CEDate::test_constructor(test_CEDate *this)

{
  CEDate *other;
  double dVar1;
  undefined1 uVar2;
  initializer_list<double> __l;
  allocator local_1bd;
  undefined4 local_1bc;
  double local_1b8;
  double jd_20190101;
  double local_1a8 [4];
  CEDate test5;
  CEDate test4;
  CEDate test2;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> greg_20190101;
  CEDate test3;
  CEDate test1;
  
  test1.mod_julian_date_ = 1.0;
  test1.gregorian_date_ = 0.5;
  test1._vptr_CEDate = (_func_int **)0x409f8c0000000000;
  test1.julian_date_ = 1.0;
  std::allocator<double>::allocator((allocator<double> *)&test2);
  __l._M_len = 4;
  __l._M_array = (iterator)&test1;
  std::vector<double,_std::allocator<double>_>::vector(&greg_20190101,__l,(allocator_type *)&test2);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&test2);
  jd_20190101 = 2458485.0;
  dVar1 = CEDate::CurrentJD();
  CEDate::CEDate(&test1,dVar1,JD);
  test3._vptr_CEDate = (_func_int **)CEDate::JD(&test1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test2,"test_constructor",(allocator *)&test5);
  test4._vptr_CEDate = (_func_int **)CONCAT44(test4._vptr_CEDate._4_4_,0x4e);
  CETestSuite::test_greaterthan
            ((double *)this,(double *)&test3,(string *)&jd_20190101,(int *)&test2);
  std::__cxx11::string::~string((string *)&test2);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&test5);
  other = &this->base_date_;
  CEDate::CEDate(&test2,other);
  test4._vptr_CEDate = (_func_int **)CEDate::JD(&test2);
  test5._vptr_CEDate = (_func_int **)CEDate::JD(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test3,"test_constructor",(allocator *)&local_1b8);
  local_1a8[0] = (double)CONCAT44(local_1a8[0]._4_4_,0x52);
  (**(code **)(*(long *)this + 0x58))(this,&test4,&test5,&test3);
  std::__cxx11::string::~string((string *)&test3);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1b8);
  dVar1 = CEDate::operator_cast_to_double(other);
  CEDate::CEDate(&test3,dVar1,JD);
  test5._vptr_CEDate = (_func_int **)CEDate::JD(&test3);
  local_1a8[0] = CEDate::JD(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test4,"test_constructor",(allocator *)&local_1bc);
  local_1b8._0_4_ = 0x56;
  (**(code **)(*(long *)this + 0x58))(this,&test5,local_1a8,&test4);
  std::__cxx11::string::~string((string *)&test4);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1bc);
  std::vector<double,_std::allocator<double>_>::vector(&local_c8,&greg_20190101);
  CEDate::CEDate(&test4,&local_c8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_c8);
  local_1a8[0] = CEDate::JD(&test4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test5,"test_constructor",(allocator *)&local_1bc);
  local_1b8 = (double)CONCAT44(local_1b8._4_4_,0x5a);
  (**(code **)(*(long *)this + 0x58))(this,local_1a8,&jd_20190101,&test5);
  std::__cxx11::string::~string((string *)&test5);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1bc);
  CEDate::CEDate(&test5,jd_20190101,JD);
  local_1b8 = CEDate::JD(&test5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1a8,"test_constructor",&local_1bd);
  local_1bc = 0x5e;
  (**(code **)(*(long *)this + 0x58))(this,&local_1b8,&jd_20190101,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1bd);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CEDate::~CEDate(&test5);
  CEDate::~CEDate(&test4);
  CEDate::~CEDate(&test3);
  CEDate::~CEDate(&test2);
  CEDate::~CEDate(&test1);
  std::vector<double,_std::allocator<double>_>::~vector(&greg_20190101);
  return (bool)uVar2;
}

Assistant:

bool test_CEDate::test_constructor(void)
{
    // Values for testing
    std::vector<double> greg_20190101 = {2019, 1.0, 1.0, 0.5};
    double              jd_20190101   = 2458485.0;

    // Default constructor. Because the default date is given as the current
    // date, the check is just that the value is greater than 01-01-2019
    CEDate test1;
    test_greaterthan(test1.JD(), jd_20190101, __func__, __LINE__);

    // Copy constructor
    CEDate test2(base_date_);
    test_double(test2.JD(), base_date_.JD(), __func__, __LINE__);

    // Copy assignment operator
    CEDate test3 = base_date_;
    test_double(test3.JD(), base_date_.JD(), __func__, __LINE__);

    // Construct from a vector
    CEDate test4(greg_20190101);
    test_double(test4.JD(), jd_20190101, __func__, __LINE__);

    // Construct from a Julian date
    CEDate test5(jd_20190101);
    test_double(test5.JD(), jd_20190101, __func__, __LINE__);

    return pass();
}